

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O3

void __thiscall KokkosTools::ChromeTracing::State::end_frame(State *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pSVar3;
  
  pSVar3 = (this->current_stack).
           super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->current_stack).
      super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
      ._M_impl.super__Vector_impl_data._M_start == pSVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Attempting to end root stack frame before Kokkos::finalize()\n",0x3d);
    return;
  }
  if (this->first == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,",\n",2);
    pSVar3 = (this->current_stack).
             super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->first = false;
  StackNode::print(pSVar3 + -1,(ostream *)this);
  pSVar3 = (this->current_stack).
           super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->current_stack).
  super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3 + -1;
  pcVar1 = pSVar3[-1].name._M_dataplus._M_p;
  paVar2 = &pSVar3[-1].name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void end_frame() {
    if (current_stack.empty()) {
      std::cerr
          << "Attempting to end root stack frame before Kokkos::finalize()\n";
      return;
    }

    if (!first) outfile << ",\n";
    first = false;

    current_stack.back().print(outfile);
    current_stack.pop_back();
  }